

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::setTextFormat(QMessageBox *this,TextFormat format)

{
  QMessageBoxPrivate *this_00;
  QLabel *this_01;
  bool bVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QLabel::setTextFormat(this_00->label,format);
  this_01 = this_00->label;
  if (format == RichText) {
    bVar1 = true;
  }
  else {
    if (format == AutoText) {
      QLabel::text((QString *)&local_40,this_01);
      QVar2.m_size = local_40.size | 0x8000000000000000;
      QVar2.field_0.m_data_utf16 = local_40.ptr;
      bVar1 = (bool)Qt::mightBeRichText(QVar2);
      QLabel::setWordWrap(this_01,bVar1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      goto LAB_004ba5ac;
    }
    bVar1 = false;
  }
  QLabel::setWordWrap(this_01,bVar1);
LAB_004ba5ac:
  if (this_00->informativeLabel != (QLabel *)0x0) {
    QLabel::setTextFormat(this_00->informativeLabel,format);
  }
  QMessageBoxPrivate::updateSize(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setTextFormat(Qt::TextFormat format)
{
    Q_D(QMessageBox);
    d->label->setTextFormat(format);
    d->label->setWordWrap(format == Qt::RichText
                    || (format == Qt::AutoText && Qt::mightBeRichText(d->label->text())));
    if (d->informativeLabel)
        d->informativeLabel->setTextFormat(format);
    d->updateSize();
}